

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::HlslParseContext::convertInitializerList
          (HlslParseContext *this,TSourceLoc *loc,TType *type,TIntermTyped *initializer,
          TIntermTyped *scalarInit)

{
  TVector<glslang::TArraySize> *pTVar1;
  TType *type_00;
  TString name;
  TString name_00;
  TString name_01;
  TString name_02;
  TString structName;
  TString structName_00;
  TString structName_01;
  TString structName_02;
  TArraySizes *pTVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermAggregate *node;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar7;
  long *plVar8;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  long lVar9;
  TSmallArrayVector *this_00;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  TIntermTyped *pTVar10;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  char *pcVar11;
  long lVar12;
  int d;
  _func_int **pp_Var13;
  ulong uVar14;
  undefined8 in_stack_fffffffffffffd38;
  TSourceLoc *loc_00;
  HlslParseContext *pHVar15;
  pool_allocator<char> local_2a8;
  TType arrayType;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_208 [40];
  TType elementType;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_148 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_120 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_f8 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_d0 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_a8 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_80 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_58 [40];
  
  iVar4 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])(initializer);
  node = (TIntermAggregate *)CONCAT44(extraout_var,iVar4);
  if ((node == (TIntermAggregate *)0x0) || ((node->super_TIntermOperator).op != EOpNull)) {
    iVar4 = (*type->_vptr_TType[0x18])(type);
    if ((char)iVar4 != '\0') {
      return initializer;
    }
    iVar4 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
    cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0xc0))
                      ((long *)CONCAT44(extraout_var_00,iVar4));
    if (cVar3 == '\0') {
      return initializer;
    }
    node = TIntermediate::makeAggregate
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                      &initializer->super_TIntermNode);
  }
  iVar4 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar4 == '\0') {
    iVar4 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar4 != '\0') {
      iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])(node);
      lVar9 = *(long *)(CONCAT44(extraout_var_05,iVar4) + 8);
      lVar12 = *(long *)(CONCAT44(extraout_var_05,iVar4) + 0x10);
      iVar4 = (*type->_vptr_TType[0x25])(type);
      if ((char)iVar4 != '\0') {
        lVar12 = lVar12 - lVar9;
        uVar14 = (lVar12 >> 3) - 1;
        lVar12 = lVar12 * 4;
        do {
          uVar14 = uVar14 + 1;
          if ((ulong)((long)(((type->field_13).referentType)->qualifier).semanticName -
                      *(long *)&((type->field_13).referentType)->field_0x8 >> 5) <= uVar14) {
            iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x32])(node);
            iVar5 = (*type->_vptr_TType[0x25])(type);
            if ((char)iVar5 != '\0') {
              lengthenList(this,loc,(TIntermSequence *)CONCAT44(extraout_var_12,iVar4),
                           (int)((ulong)((long)(((type->field_13).referentType)->qualifier).
                                               semanticName -
                                        *(long *)&((type->field_13).referentType)->field_0x8) >> 5),
                           scalarInit);
              iVar4 = (*type->_vptr_TType[0x25])(type);
              if ((char)iVar4 != '\0') {
                pcVar11 = (((type->field_13).referentType)->qualifier).semanticName;
                lVar9 = *(long *)&((type->field_13).referentType)->field_0x8;
                iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                          _vptr_TIntermNode[0x32])(node);
                if ((long)pcVar11 - lVar9 >> 5 !=
                    *(long *)(CONCAT44(extraout_var_13,iVar4) + 0x10) -
                    *(long *)(CONCAT44(extraout_var_13,iVar4) + 8) >> 3) {
                  pp_Var13 = (this->super_TParseContextBase).super_TParseVersions.
                             _vptr_TParseVersions;
                  pcVar11 = "wrong number of structure members";
LAB_0041fcbe:
                  arrayType._8_8_ = "";
                  goto LAB_0041ff4c;
                }
                iVar4 = (*type->_vptr_TType[0x25])(type);
                if ((char)iVar4 != '\0') {
                  lVar9 = 0;
                  uVar14 = 0;
                  goto LAB_0041fac3;
                }
              }
            }
            break;
          }
          iVar4 = (*type->_vptr_TType[0x25])(type);
          if ((char)iVar4 == '\0') break;
          cVar3 = (**(code **)(**(long **)((long)&((((type->field_13).structure)->
                                                                                                      
                                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ).
                                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->type +
                                          lVar12) + 0x1b0))();
          if (cVar3 != '\0') {
            pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar11 = "cannot implicitly initialize opaque members";
            goto LAB_0041fcbe;
          }
          lVar12 = lVar12 + 0x20;
          iVar4 = (*type->_vptr_TType[0x25])(type);
        } while ((char)iVar4 != '\0');
      }
      goto LAB_0041fb7f;
    }
    pHVar15 = this;
    iVar4 = (*type->_vptr_TType[0x1c])(type);
    if ((char)iVar4 == '\0') {
      iVar4 = (*type->_vptr_TType[0x1b])(type);
      if ((char)iVar4 == '\0') {
        iVar4 = (*type->_vptr_TType[0x18])(type);
        if ((char)iVar4 == '\0') {
          elementType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    (local_120,"",(pool_allocator<char> *)&elementType);
          local_2a8.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>(local_148,"",&local_2a8);
          name_01._M_dataplus._M_p = (pointer)local_148;
          name_01._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_120;
          name_01._M_string_length = in_stack_fffffffffffffd38;
          name_01.field_2._M_allocated_capacity = (size_type)loc;
          name_01.field_2._8_8_ = pHVar15;
          structName_01._M_dataplus._M_p = (pointer)local_2a8.allocator;
          structName_01._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)scalarInit;
          structName_01._M_string_length = (size_type)arrayType._vptr_TType;
          structName_01.field_2._M_allocated_capacity = arrayType._8_8_;
          structName_01.field_2._8_8_ = arrayType.qualifier.semanticName;
          TType::getCompleteString
                    ((TString *)&arrayType,type,false,true,true,true,name_01,structName_01);
          pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar11 = "unexpected initializer-list type:";
LAB_0041ff4c:
          (*pp_Var13[0x2d])(this,loc,pcVar11,"initializer list",arrayType._8_8_);
          return (TIntermTyped *)0x0;
        }
        iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(node);
        lengthenList(this,loc,(TIntermSequence *)CONCAT44(extraout_var_19,iVar4),1,scalarInit);
        iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(node);
        loc_00 = loc;
        this = pHVar15;
        if ((*(long *)(CONCAT44(extraout_var_20,iVar4) + 0x10) -
             *(long *)(CONCAT44(extraout_var_20,iVar4) + 8) & 0x7fffffff8U) != 8) {
          elementType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    (local_d0,"",(pool_allocator<char> *)&elementType);
          local_2a8.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>(local_f8,"",&local_2a8);
          name_02._M_dataplus._M_p = (pointer)local_f8;
          name_02._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_d0;
          name_02._M_string_length = in_stack_fffffffffffffd38;
          name_02.field_2._M_allocated_capacity = (size_type)loc;
          name_02.field_2._8_8_ = pHVar15;
          structName_02._M_dataplus._M_p = (pointer)local_2a8.allocator;
          structName_02._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)scalarInit;
          structName_02._M_string_length = (size_type)arrayType._vptr_TType;
          structName_02.field_2._M_allocated_capacity = arrayType._8_8_;
          structName_02.field_2._8_8_ = arrayType.qualifier.semanticName;
          this = pHVar15;
          TType::getCompleteString
                    ((TString *)&arrayType,type,false,true,true,true,name_02,structName_02);
          pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar11 = "scalar expected one element:";
          goto LAB_0041ff4c;
        }
      }
      else {
        iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(node);
        iVar5 = (*type->_vptr_TType[0xc])(type);
        lengthenList(this,loc,(TIntermSequence *)CONCAT44(extraout_var_17,iVar4),iVar5,scalarInit);
        iVar4 = (*type->_vptr_TType[0xc])(type);
        iVar5 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(node);
        loc_00 = loc;
        this = pHVar15;
        if (iVar4 != (int)((ulong)(*(long *)(CONCAT44(extraout_var_18,iVar5) + 0x10) -
                                  *(long *)(CONCAT44(extraout_var_18,iVar5) + 8)) >> 3)) {
          elementType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    (local_80,"",(pool_allocator<char> *)&elementType);
          local_2a8.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>(local_a8,"",&local_2a8);
          name._M_dataplus._M_p = (pointer)local_a8;
          name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_80;
          name._M_string_length = in_stack_fffffffffffffd38;
          name.field_2._M_allocated_capacity = (size_type)loc;
          name.field_2._8_8_ = pHVar15;
          structName._M_dataplus._M_p = (pointer)local_2a8.allocator;
          structName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)scalarInit;
          structName._M_string_length = (size_type)arrayType._vptr_TType;
          structName.field_2._M_allocated_capacity = arrayType._8_8_;
          structName.field_2._8_8_ = arrayType.qualifier.semanticName;
          this = pHVar15;
          TType::getCompleteString((TString *)&arrayType,type,false,true,true,true,name,structName);
          pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar11 = "wrong vector size (or rows in a matrix column):";
          goto LAB_0041ff4c;
        }
      }
    }
    else {
      iVar4 = TType::computeNumComponents(type);
      iVar5 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])(node);
      loc_00 = loc;
      this = pHVar15;
      if (iVar4 != (int)((ulong)(*(long *)(CONCAT44(extraout_var_06,iVar5) + 0x10) -
                                *(long *)(CONCAT44(extraout_var_06,iVar5) + 8)) >> 3)) {
        iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(node);
        this = pHVar15;
        iVar5 = (*type->_vptr_TType[0xd])(type);
        loc_00 = loc;
        pHVar15 = this;
        lengthenList(this,loc,(TIntermSequence *)CONCAT44(extraout_var_07,iVar4),iVar5,scalarInit);
        iVar4 = (*type->_vptr_TType[0xd])(type);
        iVar5 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(node);
        if (iVar4 != (int)((ulong)(*(long *)(CONCAT44(extraout_var_08,iVar5) + 0x10) -
                                  *(long *)(CONCAT44(extraout_var_08,iVar5) + 8)) >> 3)) {
          elementType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    (local_208,"",(pool_allocator<char> *)&elementType);
          local_2a8.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>(local_58,"",&local_2a8);
          name_00._M_dataplus._M_p = (pointer)local_58;
          name_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_208;
          name_00._M_string_length = in_stack_fffffffffffffd38;
          name_00.field_2._M_allocated_capacity = (size_type)loc_00;
          name_00.field_2._8_8_ = pHVar15;
          structName_00._M_dataplus._M_p = (pointer)local_2a8.allocator;
          structName_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)scalarInit;
          structName_00._M_string_length = (size_type)arrayType._vptr_TType;
          structName_00.field_2._M_allocated_capacity = arrayType._8_8_;
          structName_00.field_2._8_8_ = arrayType.qualifier.semanticName;
          TType::getCompleteString
                    ((TString *)&arrayType,type,false,true,true,true,name_00,structName_00);
          pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar11 = "wrong number of matrix columns:";
          goto LAB_0041ff4c;
        }
        TType::TType(&arrayType,type,0,false);
        iVar4 = (*type->_vptr_TType[0xd])(type);
        this = pHVar15;
        if (0 < iVar4) {
          lVar9 = 0;
          do {
            iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x32])(node);
            pTVar10 = (TIntermTyped *)
                      (**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_09,iVar4) + 8) +
                                              lVar9 * 8) + 0x18))();
            pTVar10 = convertInitializerList(this,loc,&arrayType,pTVar10,scalarInit);
            iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x32])(node);
            *(TIntermTyped **)(*(long *)(CONCAT44(extraout_var_10,iVar4) + 8) + lVar9 * 8) = pTVar10
            ;
            iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x32])(node);
            if (*(long *)(*(long *)(CONCAT44(extraout_var_11,iVar4) + 8) + lVar9 * 8) == 0) {
              return (TIntermTyped *)0x0;
            }
            lVar9 = lVar9 + 1;
            iVar4 = (*type->_vptr_TType[0xd])(type);
          } while (lVar9 < iVar4);
        }
      }
    }
LAB_0041fd39:
    iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(node);
    if (*(long *)(CONCAT44(extraout_var_21,iVar4) + 0x10) -
        *(long *)(CONCAT44(extraout_var_21,iVar4) + 8) == 8) {
      iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])(node);
      node = (TIntermAggregate *)
             (**(code **)(*(long *)**(undefined8 **)(CONCAT44(extraout_var_22,iVar4) + 8) + 0x18))()
      ;
    }
  }
  else {
    TType::TType(&arrayType,EbtVoid,EvqTemporary,1,0,0,false);
    TType::shallowCopy(&arrayType,type);
    iVar4 = (*type->_vptr_TType[0x13])(type);
    TType::copyArraySizes(&arrayType,(TArraySizes *)CONCAT44(extraout_var_01,iVar4));
    iVar4 = (*type->_vptr_TType[0x1f])(type);
    loc_00 = loc;
    if ((char)iVar4 != '\0') {
      iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])(node);
      pTVar2 = arrayType.arraySizes;
      TSmallArrayVector::changeFront
                (&(arrayType.arraySizes)->sizes,
                 (uint)((ulong)(*(long *)(CONCAT44(extraout_var_02,iVar4) + 0x10) -
                               *(long *)(CONCAT44(extraout_var_02,iVar4) + 8)) >> 3));
      pTVar2->implicitlySized = false;
      loc_00 = loc;
    }
    if ((((arrayType.arraySizes != (TArraySizes *)0x0) &&
         (pTVar1 = ((arrayType.arraySizes)->sizes).sizes,
         pTVar1 != (TVector<glslang::TArraySize> *)0x0)) &&
        (1 < (int)((ulong)((long)(pTVar1->
                                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ).
                                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pTVar1->
                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ).
                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4))) &&
       (iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(node),
       *(long *)(CONCAT44(extraout_var_03,iVar4) + 0x10) !=
       *(long *)(CONCAT44(extraout_var_03,iVar4) + 8))) {
      iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])(node);
      plVar7 = (long *)(**(code **)(*(long *)**(undefined8 **)(CONCAT44(extraout_var_04,iVar4) + 8)
                                   + 0x18))();
      plVar8 = (long *)(**(code **)(*plVar7 + 0xf0))(plVar7);
      cVar3 = (**(code **)(*plVar8 + 0xe8))(plVar8);
      if (cVar3 != '\0') {
        pTVar1 = ((arrayType.arraySizes)->sizes).sizes;
        if (pTVar1 == (TVector<glslang::TArraySize> *)0x0) {
          iVar4 = 0;
        }
        else {
          iVar4 = (int)((ulong)((long)(pTVar1->
                                      super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                      ).
                                      super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pTVar1->
                                     super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                     ).
                                     super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
        }
        plVar8 = (long *)(**(code **)(*plVar7 + 0xf0))(plVar7);
        lVar9 = (**(code **)(*plVar8 + 0x98))(plVar8);
        lVar9 = *(long *)(lVar9 + 8);
        if (lVar9 == 0) {
          iVar5 = 1;
        }
        else {
          iVar5 = (int)((ulong)(*(long *)(lVar9 + 0x10) - *(long *)(lVar9 + 8)) >> 4) + 1;
        }
        if (iVar4 == iVar5) {
          iVar4 = 1;
          while( true ) {
            pTVar1 = ((arrayType.arraySizes)->sizes).sizes;
            if (pTVar1 == (TVector<glslang::TArraySize> *)0x0) {
              iVar5 = 0;
            }
            else {
              iVar5 = (int)((ulong)((long)(pTVar1->
                                          super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                          ).
                                          super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pTVar1->
                                         super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                         ).
                                         super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4);
            }
            if (iVar5 <= iVar4) break;
            uVar6 = TSmallArrayVector::getDimSize(&(arrayType.arraySizes)->sizes,iVar4);
            pTVar2 = arrayType.arraySizes;
            if (uVar6 == 0) {
              plVar8 = (long *)(**(code **)(*plVar7 + 0xf0))(plVar7);
              this_00 = (TSmallArrayVector *)(**(code **)(*plVar8 + 0x98))(plVar8);
              uVar6 = TSmallArrayVector::getDimSize(this_00,iVar4 + -1);
              TSmallArrayVector::setDimSize(&pTVar2->sizes,iVar4,uVar6);
            }
            iVar4 = iVar4 + 1;
          }
        }
      }
    }
    iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(node);
    uVar6 = TSmallArrayVector::frontSize(&(arrayType.arraySizes)->sizes);
    lengthenList(this,loc_00,(TIntermSequence *)CONCAT44(extraout_var_23,iVar4),uVar6,scalarInit);
    TType::TType(&elementType,&arrayType,0,false);
    uVar6 = TSmallArrayVector::frontSize(&(arrayType.arraySizes)->sizes);
    if (0 < (int)uVar6) {
      lVar9 = 0;
      do {
        iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(node);
        pTVar10 = (TIntermTyped *)
                  (**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_24,iVar4) + 8) +
                                          lVar9 * 8) + 0x18))();
        pTVar10 = convertInitializerList(this,loc_00,&elementType,pTVar10,scalarInit);
        iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(node);
        *(TIntermTyped **)(*(long *)(CONCAT44(extraout_var_25,iVar4) + 8) + lVar9 * 8) = pTVar10;
        iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(node);
        if (*(long *)(*(long *)(CONCAT44(extraout_var_26,iVar4) + 8) + lVar9 * 8) == 0) {
          return (TIntermTyped *)0x0;
        }
        lVar9 = lVar9 + 1;
        uVar6 = TSmallArrayVector::frontSize(&(arrayType.arraySizes)->sizes);
      } while (lVar9 < (int)uVar6);
    }
    type = &arrayType;
  }
  pTVar10 = addConstructor(this,loc_00,(TIntermTyped *)node,type);
  return pTVar10;
  while( true ) {
    type_00 = *(TType **)
               ((long)&((((type->field_13).structure)->
                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ).
                        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ._M_impl.super__Vector_impl_data._M_start)->type + lVar9);
    iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(node);
    pTVar10 = (TIntermTyped *)
              (**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_14,iVar4) + 8) + uVar14 * 8)
                          + 0x18))();
    pTVar10 = convertInitializerList(this,loc,type_00,pTVar10,scalarInit);
    iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(node);
    *(TIntermTyped **)(*(long *)(CONCAT44(extraout_var_15,iVar4) + 8) + uVar14 * 8) = pTVar10;
    iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(node);
    if (*(long *)(*(long *)(CONCAT44(extraout_var_16,iVar4) + 8) + uVar14 * 8) == 0) {
      return (TIntermTyped *)0x0;
    }
    uVar14 = uVar14 + 1;
    iVar4 = (*type->_vptr_TType[0x25])(type);
    lVar9 = lVar9 + 0x20;
    if ((char)iVar4 == '\0') break;
LAB_0041fac3:
    loc_00 = loc;
    if ((ulong)((long)(((type->field_13).referentType)->qualifier).semanticName -
                *(long *)&((type->field_13).referentType)->field_0x8 >> 5) <= uVar14)
    goto LAB_0041fd39;
    iVar4 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar4 == '\0') break;
  }
LAB_0041fb7f:
  __assert_fail("isStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
}

Assistant:

TIntermTyped* HlslParseContext::convertInitializerList(const TSourceLoc& loc, const TType& type,
                                                       TIntermTyped* initializer, TIntermTyped* scalarInit)
{
    // Will operate recursively.  Once a subtree is found that is constructor style,
    // everything below it is already good: Only the "top part" of the initializer
    // can be an initializer list, where "top part" can extend for several (or all) levels.

    // see if we have bottomed out in the tree within the initializer-list part
    TIntermAggregate* initList = initializer->getAsAggregate();
    if (initList == nullptr || initList->getOp() != EOpNull) {
        // We don't have a list, but if it's a scalar and the 'type' is a
        // composite, we need to lengthen below to make it useful.
        // Otherwise, this is an already formed object to initialize with.
        if (type.isScalar() || !initializer->getType().isScalar())
            return initializer;
        else
            initList = intermediate.makeAggregate(initializer);
    }

    // Of the initializer-list set of nodes, need to process bottom up,
    // so recurse deep, then process on the way up.

    // Go down the tree here...
    if (type.isArray()) {
        // The type's array might be unsized, which could be okay, so base sizes on the size of the aggregate.
        // Later on, initializer execution code will deal with array size logic.
        TType arrayType;
        arrayType.shallowCopy(type);                     // sharing struct stuff is fine
        arrayType.copyArraySizes(*type.getArraySizes()); // but get a fresh copy of the array information, to edit below

        // edit array sizes to fill in unsized dimensions
        if (type.isUnsizedArray())
            arrayType.changeOuterArraySize((int)initList->getSequence().size());

        // set unsized array dimensions that can be derived from the initializer's first element
        if (arrayType.isArrayOfArrays() && initList->getSequence().size() > 0) {
            TIntermTyped* firstInit = initList->getSequence()[0]->getAsTyped();
            if (firstInit->getType().isArray() &&
                arrayType.getArraySizes()->getNumDims() == firstInit->getType().getArraySizes()->getNumDims() + 1) {
                for (int d = 1; d < arrayType.getArraySizes()->getNumDims(); ++d) {
                    if (arrayType.getArraySizes()->getDimSize(d) == UnsizedArraySize)
                        arrayType.getArraySizes()->setDimSize(d, firstInit->getType().getArraySizes()->getDimSize(d - 1));
                }
            }
        }

        // lengthen list to be long enough
        lengthenList(loc, initList->getSequence(), arrayType.getOuterArraySize(), scalarInit);

        // recursively process each element
        TType elementType(arrayType, 0); // dereferenced type
        for (int i = 0; i < arrayType.getOuterArraySize(); ++i) {
            initList->getSequence()[i] = convertInitializerList(loc, elementType,
                                                                initList->getSequence()[i]->getAsTyped(), scalarInit);
            if (initList->getSequence()[i] == nullptr)
                return nullptr;
        }

        return addConstructor(loc, initList, arrayType);
    } else if (type.isStruct()) {
        // do we have implicit assignments to opaques?
        for (size_t i = initList->getSequence().size(); i < type.getStruct()->size(); ++i) {
            if ((*type.getStruct())[i].type->containsOpaque()) {
                error(loc, "cannot implicitly initialize opaque members", "initializer list", "");
                return nullptr;
            }
        }

        // lengthen list to be long enough
        lengthenList(loc, initList->getSequence(), static_cast<int>(type.getStruct()->size()), scalarInit);

        if (type.getStruct()->size() != initList->getSequence().size()) {
            error(loc, "wrong number of structure members", "initializer list", "");
            return nullptr;
        }
        for (size_t i = 0; i < type.getStruct()->size(); ++i) {
            initList->getSequence()[i] = convertInitializerList(loc, *(*type.getStruct())[i].type,
                                                                initList->getSequence()[i]->getAsTyped(), scalarInit);
            if (initList->getSequence()[i] == nullptr)
                return nullptr;
        }
    } else if (type.isMatrix()) {
        if (type.computeNumComponents() == (int)initList->getSequence().size()) {
            // This means the matrix is initialized component-wise, rather than as
            // a series of rows and columns.  We can just use the list directly as
            // a constructor; no further processing needed.
        } else {
            // lengthen list to be long enough
            lengthenList(loc, initList->getSequence(), type.getMatrixCols(), scalarInit);

            if (type.getMatrixCols() != (int)initList->getSequence().size()) {
                error(loc, "wrong number of matrix columns:", "initializer list", type.getCompleteString().c_str());
                return nullptr;
            }
            TType vectorType(type, 0); // dereferenced type
            for (int i = 0; i < type.getMatrixCols(); ++i) {
                initList->getSequence()[i] = convertInitializerList(loc, vectorType,
                                                                    initList->getSequence()[i]->getAsTyped(), scalarInit);
                if (initList->getSequence()[i] == nullptr)
                    return nullptr;
            }
        }
    } else if (type.isVector()) {
        // lengthen list to be long enough
        lengthenList(loc, initList->getSequence(), type.getVectorSize(), scalarInit);

        // error check; we're at bottom, so work is finished below
        if (type.getVectorSize() != (int)initList->getSequence().size()) {
            error(loc, "wrong vector size (or rows in a matrix column):", "initializer list",
                  type.getCompleteString().c_str());
            return nullptr;
        }
    } else if (type.isScalar()) {
        // lengthen list to be long enough
        lengthenList(loc, initList->getSequence(), 1, scalarInit);

        if ((int)initList->getSequence().size() != 1) {
            error(loc, "scalar expected one element:", "initializer list", type.getCompleteString().c_str());
            return nullptr;
        }
    } else {
        error(loc, "unexpected initializer-list type:", "initializer list", type.getCompleteString().c_str());
        return nullptr;
    }

    // Now that the subtree is processed, process this node as if the
    // initializer list is a set of arguments to a constructor.
    TIntermTyped* emulatedConstructorArguments;
    if (initList->getSequence().size() == 1)
        emulatedConstructorArguments = initList->getSequence()[0]->getAsTyped();
    else
        emulatedConstructorArguments = initList;

    return addConstructor(loc, emulatedConstructorArguments, type);
}